

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::mutable_options(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  Arena *arena;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 8;
  if ((this->field_0)._impl_.options_ == (FileOptions *)0x0) {
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pFVar1 = (FileOptions *)Arena::DefaultConstruct<google::protobuf::FileOptions>(arena);
    (this->field_0)._impl_.options_ = pFVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::FileOptions* PROTOBUF_NONNULL FileDescriptorProto::mutable_options()
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000008u;
  ::google::protobuf::FileOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.FileDescriptorProto.options)
  return _msg;
}